

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeDebugFunctionType
          (Builder *this,Id returnType,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes)

{
  bool bVar1;
  Id resultId;
  Id IVar2;
  mapped_type_conflict *pmVar3;
  Instruction *this_00;
  size_type sVar4;
  reference puVar5;
  value_type local_58;
  Id local_50;
  Id local_4c;
  const_iterator cStack_48;
  uint paramType;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  Instruction *type;
  Id typeId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes_local;
  Builder *pBStack_10;
  Id returnType_local;
  Builder *this_local;
  
  paramTypes_local._4_4_ = returnType;
  pBStack_10 = this;
  pmVar3 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->debugId,(key_type_conflict *)((long)&paramTypes_local + 4));
  if (*pmVar3 == 0) {
    __assert_fail("debugId[returnType] != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x2a6,"Id spv::Builder::makeDebugFunctionType(Id, const std::vector<Id> &)");
  }
  resultId = getUniqueId(this);
  this_00 = (Instruction *)::operator_new(0x60);
  IVar2 = makeVoidType(this);
  spv::Instruction::Instruction(this_00,resultId,IVar2,OpExtInst);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(paramTypes);
  spv::Instruction::reserveOperands(this_00,sVar4 + 4);
  spv::Instruction::addIdOperand(this_00,this->nonSemanticShaderDebugInfo);
  spv::Instruction::addImmediateOperand(this_00,8);
  IVar2 = makeUintConstant(this,3,false);
  spv::Instruction::addIdOperand(this_00,IVar2);
  pmVar3 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->debugId,(key_type_conflict *)((long)&paramTypes_local + 4));
  spv::Instruction::addIdOperand(this_00,*pmVar3);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(paramTypes);
  cStack_48 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(paramTypes);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8);
    if (!bVar1) {
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_58,
                 this_00);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,&local_58);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_58);
      Module::mapInstruction(&this->module,this_00);
      return resultId;
    }
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    local_4c = *puVar5;
    bVar1 = isPointerType(this,local_4c);
    if (bVar1) {
LAB_006d42b9:
      local_50 = getContainedTypeId(this,local_4c);
      pmVar3 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,&local_50);
      spv::Instruction::addIdOperand(this_00,*pmVar3);
    }
    else {
      bVar1 = isArrayType(this,local_4c);
      if (bVar1) goto LAB_006d42b9;
      pmVar3 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,&local_4c);
      spv::Instruction::addIdOperand(this_00,*pmVar3);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

Id Builder::makeDebugFunctionType(Id returnType, const std::vector<Id>& paramTypes)
{
    assert(debugId[returnType] != 0);

    Id typeId = getUniqueId();
    auto type = new Instruction(typeId, makeVoidType(), OpExtInst);
    type->reserveOperands(paramTypes.size() + 4);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeFunction);
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsPublic));
    type->addIdOperand(debugId[returnType]);
    for (auto const paramType : paramTypes) {
        if (isPointerType(paramType) || isArrayType(paramType)) {
            type->addIdOperand(debugId[getContainedTypeId(paramType)]);
        }
        else {
            type->addIdOperand(debugId[paramType]);
        }
    }
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);
    return typeId;
}